

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O0

MapPalette * build_greyscale_palette(World *world,MapPalette *palette,float luminance)

{
  byte extraout_AL;
  byte bVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  reference pvVar5;
  float *pfVar6;
  void *extraout_RDX;
  char *in_R8;
  int in_R9D;
  uint in_stack_ffffffffffffffa8;
  value_type local_40;
  float local_3c;
  float local_38;
  byte local_31;
  void *pvStack_30;
  uint8_t average;
  size_t i;
  MapPalette *pal;
  MapPalette *pMStack_18;
  float luminance_local;
  MapPalette *palette_local;
  World *world_local;
  
  pal._4_4_ = luminance;
  pMStack_18 = palette;
  palette_local = (MapPalette *)world;
  pvVar3 = operator_new(0x34);
  memcpy(pvVar3,pMStack_18,0x34);
  pvStack_30 = (void *)0x0;
  i = (size_t)pvVar3;
  while( true ) {
    pvVar3 = pvStack_30;
    pvVar4 = (void *)std::array<Color,_13UL>::size((array<Color,_13UL> *)i);
    if (pvVar4 <= pvVar3) break;
    pvVar3 = pvStack_30;
    pvVar5 = std::array<Color,_13UL>::at((array<Color,_13UL> *)i,(size_type)pvStack_30);
    Color::r(pvVar5,pvVar3,extraout_RDX,(int)pvVar4,in_R8,in_R9D,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = (uint)extraout_AL;
    pvVar5 = std::array<Color,_13UL>::at((array<Color,_13UL> *)i,(size_type)pvStack_30);
    bVar1 = Color::g(pvVar5);
    iVar2 = in_stack_ffffffffffffffa8 + bVar1;
    pvVar5 = std::array<Color,_13UL>::at((array<Color,_13UL> *)i,(size_type)pvStack_30);
    bVar1 = Color::b(pvVar5);
    local_31 = (byte)((ulong)(iVar2 + (uint)bVar1) * 0x55555556 >> 0x20);
    local_38 = (float)local_31 * pal._4_4_;
    local_3c = 255.0;
    pfVar6 = std::min<float>(&local_38,&local_3c);
    local_31 = (byte)(int)*pfVar6;
    Color::Color(&local_40,local_31,local_31,local_31);
    pvVar5 = std::array<Color,_13UL>::operator[]((array<Color,_13UL> *)i,(size_type)pvStack_30);
    *pvVar5 = local_40;
    pvStack_30 = (void *)((long)pvStack_30 + 1);
  }
  World::add_map_palette((World *)palette_local,(MapPalette *)i);
  return (MapPalette *)i;
}

Assistant:

static MapPalette* build_greyscale_palette(World& world, MapPalette* palette, float luminance = 1.f)
{
    MapPalette* pal = new MapPalette(*palette);
    for(size_t i=0 ; i<pal->size() ; ++i)
    {
        uint8_t average = (pal->at(i).r() + pal->at(i).g() + pal->at(i).b()) / 3;
        average = (uint8_t)std::min((float)average * luminance, 255.f);
        (*pal)[i] = { average, average, average };
    }

//    Color color_red = Color(0xC0, 0x00, 0x00);
//
//    MapPalette* pal = new MapPalette({
//            color_red, color_red, color_red, color_red, color_red, color_red, color_red,
//            color_red, color_red, color_red, color_red, color_red, color_red
//    });

    world.add_map_palette(pal);
    return pal;
}